

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::Galactic2Observed
              (double glon,double glat,double *az,double *zen,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type,double wavelength,double *observed_glon,double *observed_glat,
              double *hour_angle)

{
  int iVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  double *in_RSI;
  double *in_RDI;
  int *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double *in_XMM1_Qa;
  double unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double *in_stack_00000028;
  double *in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000050;
  double in_stack_00000058;
  double in_stack_00000060;
  double in_stack_00000068;
  double in_stack_00000070;
  int error_code;
  
  if (*in_R8 == 0) {
    in_XMM0_Qa = in_XMM0_Qa * 0.017453292519943295;
    in_XMM1_Qa = (double *)((double)in_XMM1_Qa * 0.017453292519943295);
  }
  (**(code **)(*in_RDX + 0x20))();
  CEObserver::Longitude_Rad(in_RCX);
  CEObserver::Latitude_Rad(in_RCX);
  CEObserver::Elevation_m(in_RCX);
  CEObserver::Pressure_hPa(in_RCX);
  CEObserver::Temperature_C(in_RCX);
  CEObserver::RelativeHumidity(in_RCX);
  CEDate::dut1((CEDate *)0x130501);
  CEDate::xpolar((CEDate *)0x130517);
  CEDate::ypolar((CEDate *)0x13052d);
  iVar1 = Galactic2Observed(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                            in_stack_00000020,in_stack_00000018,(double)in_stack_00000010,
                            (double)in_stack_00000008,unaff_retaddr,in_XMM0_Qa,in_stack_00000050,
                            in_stack_00000058,in_stack_00000060,in_stack_00000068,in_stack_00000070,
                            in_XMM1_Qa,in_RDI,in_RSI);
  if (*in_R8 == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    *in_RSI = *in_RSI * 57.29577951308232;
    if (in_R9 != (double *)0x0) {
      *in_R9 = *in_R9 * 57.29577951308232;
    }
    if (in_stack_00000008 != (double *)0x0) {
      *in_stack_00000008 = *in_stack_00000008 * 57.29577951308232;
    }
    if (in_stack_00000010 != (double *)0x0) {
      *in_stack_00000010 = *in_stack_00000010 * 57.29577951308232;
    }
  }
  return iVar1;
}

Assistant:

int CECoordinates::Galactic2Observed(double glon, double glat,
                                     double *az, double *zen,
                                     const CEDate&     date,
                                     const CEObserver& observer,
                                     const CEAngleType& angle_type,
                                     double wavelength,
                                     double *observed_glon,
                                     double *observed_glat,
                                     double *hour_angle)
{
    // Convert angles to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        glon *= DD2R ;
        glat *= DD2R ;
    }
    
    // Do the conversion
    int error_code = Galactic2Observed(glon, glat,
                                       az, zen,
                                       date.JD(),
                                       observer.Longitude_Rad(),
                                       observer.Latitude_Rad(),
                                       observer.Elevation_m(),
                                       observer.Pressure_hPa(),
                                       observer.Temperature_C(),
                                       observer.RelativeHumidity(),
                                       date.dut1(),
                                       date.xpolar(),
                                       date.ypolar(),
                                       wavelength,
                                       observed_glon, observed_glat, hour_angle) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *az  *= DR2D ;
        *zen *= DR2D ;
        if (observed_glon != nullptr) *observed_glon *= DR2D ;
        if (observed_glat != nullptr) *observed_glat *= DR2D ;
        if (hour_angle    != nullptr) *hour_angle    *= DR2D ;
    }
    
    return error_code;
}